

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::asio_service_impl::stop(asio_service_impl *this)

{
  condition_variable cVar1;
  condition_variable cVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  unique_lock<std::mutex> *__lock;
  __shared_ptr *this_00;
  long in_RDI;
  ptr<std::thread> *t;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *__range1;
  uint8_t exp;
  unique_lock<std::mutex> lock;
  int running;
  mutex_type *in_stack_fffffffffffffe08;
  unique_lock<std::mutex> *in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1a;
  condition_variable in_stack_fffffffffffffe1b;
  undefined1 in_stack_fffffffffffffe1c;
  condition_variable in_stack_fffffffffffffe1d;
  undefined1 in_stack_fffffffffffffe1e;
  condition_variable in_stack_fffffffffffffe1f;
  undefined1 in_stack_fffffffffffffe30;
  condition_variable in_stack_fffffffffffffe31;
  undefined1 in_stack_fffffffffffffe32;
  undefined1 in_stack_fffffffffffffe33;
  undefined1 in_stack_fffffffffffffe34;
  undefined1 in_stack_fffffffffffffe35;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  condition_variable *this_01;
  _Self local_d0;
  _Self local_c8;
  long local_c0;
  int local_b4;
  duration<long,std::ratio<1l,1l>> local_b0 [11];
  condition_variable local_a5 [33];
  int local_84 [3];
  undefined4 local_78;
  undefined1 local_71;
  condition_variable *local_70;
  unique_lock<std::mutex> *local_68;
  undefined4 local_60;
  undefined4 local_5c;
  int *local_58;
  int *local_50;
  bool local_46;
  undefined1 local_45;
  memory_order local_44;
  undefined4 local_40;
  undefined1 local_39;
  condition_variable *local_38;
  unique_lock<std::mutex> *local_30;
  bool local_21;
  undefined4 local_20;
  memory_order local_1c;
  undefined4 local_18;
  undefined4 local_14;
  int *local_10;
  int *local_8;
  
  local_84[0] = 1;
  piVar5 = (int *)(in_RDI + 0xb8);
  local_5c = 0;
  local_60 = 5;
  local_58 = local_84;
  local_50 = piVar5;
  local_1c = std::__cmpexch_failure_order((memory_order)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  local_14 = 0;
  local_18 = 5;
  local_20 = 0;
  switch(0x242af2) {
  default:
    if (local_1c - memory_order_consume < 2) {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    else {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    break;
  case 2:
    if (local_1c - memory_order_consume < 2) {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    else {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    break;
  case 3:
    if (local_1c - memory_order_consume < 2) {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    else {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    break;
  case 4:
    if (local_1c - memory_order_consume < 2) {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
    else {
      LOCK();
      iVar4 = *piVar5;
      local_21 = local_84[0] == iVar4;
      if (local_21) {
        *piVar5 = 0;
        iVar4 = local_84[0];
      }
      UNLOCK();
      if (!local_21) {
        local_84[0] = iVar4;
      }
    }
  }
  local_10 = local_84;
  local_8 = piVar5;
  if (local_21 != false) {
    std::unique_lock<std::mutex>::unique_lock(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              *)CONCAT17(in_stack_fffffffffffffe37,
                         CONCAT16(in_stack_fffffffffffffe36,
                                  CONCAT15(in_stack_fffffffffffffe35,
                                           CONCAT14(in_stack_fffffffffffffe34,
                                                    CONCAT13(in_stack_fffffffffffffe33,
                                                             CONCAT12(in_stack_fffffffffffffe32,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))));
    local_a5[0] = (condition_variable)0x0;
    __lock = (unique_lock<std::mutex> *)(in_RDI + 0xe8);
    this_01 = local_a5;
    local_71 = 1;
    local_78 = 5;
    local_70 = this_01;
    local_68 = __lock;
    local_44 = std::__cmpexch_failure_order
                         ((memory_order)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    local_39 = 1;
    local_40 = 5;
    local_45 = 1;
    local_38 = this_01;
    local_30 = __lock;
    switch(0x243227) {
    default:
      if (local_44 - memory_order_consume < 2) {
        cVar1 = *this_01;
        LOCK();
        cVar2 = *(condition_variable *)&__lock->_M_device;
        local_46 = cVar1 == cVar2;
        if (local_46) {
          *(undefined1 *)&__lock->_M_device = 1;
          cVar2 = cVar1;
        }
        UNLOCK();
        if (!local_46) {
          *this_01 = cVar2;
        }
      }
      else if (local_44 == memory_order_seq_cst) {
        cVar1 = *this_01;
        LOCK();
        cVar2 = *(condition_variable *)&__lock->_M_device;
        local_46 = cVar1 == cVar2;
        if (local_46) {
          *(undefined1 *)&__lock->_M_device = 1;
          cVar2 = cVar1;
        }
        UNLOCK();
        if (!local_46) {
          *this_01 = cVar2;
        }
      }
      else {
        cVar2 = *this_01;
        LOCK();
        in_stack_fffffffffffffe31 = *(condition_variable *)&__lock->_M_device;
        in_stack_fffffffffffffe30 = cVar2 == in_stack_fffffffffffffe31;
        if ((bool)in_stack_fffffffffffffe30) {
          *(undefined1 *)&__lock->_M_device = 1;
          in_stack_fffffffffffffe31 = cVar2;
        }
        UNLOCK();
        local_46 = (bool)in_stack_fffffffffffffe30;
        if (!(bool)in_stack_fffffffffffffe30) {
          *this_01 = in_stack_fffffffffffffe31;
        }
      }
      break;
    case 2:
      if (local_44 - memory_order_consume < 2) {
        cVar1 = *this_01;
        LOCK();
        cVar2 = *(condition_variable *)&__lock->_M_device;
        local_46 = cVar1 == cVar2;
        if (local_46) {
          *(undefined1 *)&__lock->_M_device = 1;
          cVar2 = cVar1;
        }
        UNLOCK();
        if (!local_46) {
          *this_01 = cVar2;
        }
      }
      else if (local_44 == memory_order_seq_cst) {
        cVar1 = *this_01;
        LOCK();
        cVar2 = *(condition_variable *)&__lock->_M_device;
        local_46 = cVar1 == cVar2;
        if (local_46) {
          *(undefined1 *)&__lock->_M_device = 1;
          cVar2 = cVar1;
        }
        UNLOCK();
        if (!local_46) {
          *this_01 = cVar2;
        }
      }
      else {
        cVar1 = *this_01;
        LOCK();
        cVar2 = *(condition_variable *)&__lock->_M_device;
        local_46 = cVar1 == cVar2;
        if (local_46) {
          *(undefined1 *)&__lock->_M_device = 1;
          cVar2 = cVar1;
        }
        UNLOCK();
        if (!local_46) {
          *this_01 = cVar2;
        }
      }
      break;
    case 3:
      if (local_44 - memory_order_consume < 2) {
        cVar1 = *this_01;
        LOCK();
        cVar2 = *(condition_variable *)&__lock->_M_device;
        local_46 = cVar1 == cVar2;
        if (local_46) {
          *(undefined1 *)&__lock->_M_device = 1;
          cVar2 = cVar1;
        }
        UNLOCK();
        if (!local_46) {
          *this_01 = cVar2;
        }
      }
      else if (local_44 == memory_order_seq_cst) {
        cVar1 = *this_01;
        LOCK();
        cVar2 = *(condition_variable *)&__lock->_M_device;
        local_46 = cVar1 == cVar2;
        if (local_46) {
          *(undefined1 *)&__lock->_M_device = 1;
          cVar2 = cVar1;
        }
        UNLOCK();
        if (!local_46) {
          *this_01 = cVar2;
        }
      }
      else {
        cVar1 = *this_01;
        LOCK();
        cVar2 = *(condition_variable *)&__lock->_M_device;
        local_46 = cVar1 == cVar2;
        if (local_46) {
          *(undefined1 *)&__lock->_M_device = 1;
          cVar2 = cVar1;
        }
        UNLOCK();
        if (!local_46) {
          *this_01 = cVar2;
        }
      }
      break;
    case 4:
      if (local_44 - memory_order_consume < 2) {
        cVar2 = *this_01;
        LOCK();
        in_stack_fffffffffffffe1d = *(condition_variable *)&__lock->_M_device;
        in_stack_fffffffffffffe1c = cVar2 == in_stack_fffffffffffffe1d;
        if ((bool)in_stack_fffffffffffffe1c) {
          *(undefined1 *)&__lock->_M_device = 1;
          in_stack_fffffffffffffe1d = cVar2;
        }
        UNLOCK();
        local_46 = (bool)in_stack_fffffffffffffe1c;
        if (!(bool)in_stack_fffffffffffffe1c) {
          *this_01 = in_stack_fffffffffffffe1d;
          local_46 = (bool)in_stack_fffffffffffffe1c;
        }
      }
      else if (local_44 == memory_order_seq_cst) {
        cVar2 = *this_01;
        LOCK();
        in_stack_fffffffffffffe1b = *(condition_variable *)&__lock->_M_device;
        in_stack_fffffffffffffe1a = cVar2 == in_stack_fffffffffffffe1b;
        if ((bool)in_stack_fffffffffffffe1a) {
          *(undefined1 *)&__lock->_M_device = 1;
          in_stack_fffffffffffffe1b = cVar2;
        }
        UNLOCK();
        local_46 = (bool)in_stack_fffffffffffffe1a;
        if (!(bool)in_stack_fffffffffffffe1a) {
          *this_01 = in_stack_fffffffffffffe1b;
          local_46 = (bool)in_stack_fffffffffffffe1a;
        }
      }
      else {
        cVar2 = *this_01;
        LOCK();
        in_stack_fffffffffffffe1f = *(condition_variable *)&__lock->_M_device;
        in_stack_fffffffffffffe1e = cVar2 == in_stack_fffffffffffffe1f;
        if ((bool)in_stack_fffffffffffffe1e) {
          *(undefined1 *)&__lock->_M_device = 1;
          in_stack_fffffffffffffe1f = cVar2;
        }
        UNLOCK();
        local_46 = (bool)in_stack_fffffffffffffe1e;
        if (!(bool)in_stack_fffffffffffffe1e) {
          *this_01 = in_stack_fffffffffffffe1f;
          local_46 = (bool)in_stack_fffffffffffffe1e;
        }
      }
    }
    if (local_46 != false) {
      in_stack_fffffffffffffe10 = (unique_lock<std::mutex> *)(in_RDI + 0x118);
      local_b4 = 1;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_b0,&local_b4);
      std::condition_variable::wait_for<long,std::ratio<1l,1l>>
                (this_01,__lock,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffffe37,
                          CONCAT16(in_stack_fffffffffffffe36,
                                   CONCAT15(in_stack_fffffffffffffe35,
                                            CONCAT14(in_stack_fffffffffffffe34,
                                                     CONCAT13(in_stack_fffffffffffffe33,
                                                              CONCAT12(in_stack_fffffffffffffe32,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))));
    }
    std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffe10);
  }
  std::__atomic_base<unsigned_char>::operator=
            ((__atomic_base<unsigned_char> *)
             CONCAT17(in_stack_fffffffffffffe1f,
                      CONCAT16(in_stack_fffffffffffffe1e,
                               CONCAT15(in_stack_fffffffffffffe1d,
                                        CONCAT14(in_stack_fffffffffffffe1c,
                                                 CONCAT13(in_stack_fffffffffffffe1b,
                                                          CONCAT12(in_stack_fffffffffffffe1a,
                                                                   in_stack_fffffffffffffe18)))))),
             (__int_type_conflict4)((ulong)in_stack_fffffffffffffe10 >> 0x38));
  asio::io_context::stop((io_context *)0x243712);
  while (bVar3 = asio::io_context::stopped((io_context *)0x24371f), ((bVar3 ^ 0xffU) & 1) != 0) {
    std::this_thread::yield();
  }
  local_c0 = in_RDI + 0x150;
  local_c8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::begin
                 ((list<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                   *)in_stack_fffffffffffffe08);
  local_d0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::end
                 ((list<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                   *)in_stack_fffffffffffffe08);
  while (bVar3 = std::operator!=(&local_c8,&local_d0), bVar3) {
    this_00 = (__shared_ptr *)
              std::_List_iterator<std::shared_ptr<std::thread>_>::operator*
                        ((_List_iterator<std::shared_ptr<std::thread>_> *)0x243796);
    bVar3 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar3) {
      std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2437be);
      bVar3 = std::thread::joinable((thread *)in_stack_fffffffffffffe10);
      if (bVar3) {
        std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2437d9);
        std::thread::join();
      }
    }
    std::_List_iterator<std::shared_ptr<std::thread>_>::operator++(&local_c8);
  }
  return;
}

Assistant:

void asio_service_impl::stop() {
    int running = 1;
    if (continue_.compare_exchange_strong(running, 0)) {
        std::unique_lock<std::mutex> lock(stopping_lock_);
        asio_timer_.cancel();

        uint8_t exp = 0;
        if (stopping_status_.compare_exchange_strong(exp, 1)) {
            // 0 means that timer_handler() is not yet called.
            // make it 1, timer_handler() will call notify().
            stopping_cv_.wait_for(lock, std::chrono::seconds(1));
        }
    }

    // Stop all workers.
    stopping_status_ = 1;

    io_svc_.stop();
    while (!io_svc_.stopped()) {
        std::this_thread::yield();
    }

    for (ptr<std::thread>& t: worker_handles_) {
        if (t && t->joinable()) {
            t->join();
        }
    }
}